

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::VarintTest_TestWriteNullConstant_Test::TestBody
          (VarintTest_TestWriteNullConstant_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ByteBuffer buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  internal local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  long *local_60 [2];
  long local_50 [2];
  ByteBuffer local_40 [8];
  undefined1 local_38 [40];
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_40,10);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,Varint::kNullString_abi_cxx11_,
             _regfree + Varint::kNullString_abi_cxx11_);
  bidfx_public_api::tools::Varint::WriteString(local_38,local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  local_b0.field_2._M_allocated_capacity._0_2_ = 0;
  local_b0._M_string_length = 1;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  bidfx_public_api::tools::ByteBuffer::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_70,"std::string(\"\\000\", 1)","buffer.ToString()",&local_b0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                             local_b0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/varint_test.cpp"
               ,0xcb,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_b0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_40);
  return;
}

Assistant:

TEST(VarintTest, TestWriteNullConstant)
{
    ByteBuffer buffer = ByteBuffer(10);
    Varint::WriteString(buffer, Varint::kNullString);
    EXPECT_EQ(std::string("\000", 1), buffer.ToString());
}